

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_port_resp(connectdata *conn,int ftpcode)

{
  undefined1 *puVar1;
  int iVar2;
  Curl_easy *data;
  CURLcode CVar3;
  ftpport fcmd;
  
  data = conn->data;
  if (ftpcode - 200U < 100) {
    Curl_infof(data,"Connect data stream actively\n");
    (conn->proto).ftpc.state = FTP_STOP;
    CVar3 = ftp_dophase_done(conn,false);
    return CVar3;
  }
  iVar2 = (conn->proto).ftpc.count1;
  if (iVar2 == 0) {
    Curl_infof(data,"disabling EPRT usage\n");
    puVar1 = &(conn->bits).field_0x6;
    *puVar1 = *puVar1 & 0xfb;
  }
  fcmd = iVar2 + PORT;
  if (fcmd == DONE) {
    Curl_failf(data,"Failed to do PORT");
    return CURLE_FTP_PORT_FAILED;
  }
  CVar3 = ftp_state_use_port(conn,fcmd);
  return CVar3;
}

Assistant:

static CURLcode ftp_state_port_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  ftpport fcmd = (ftpport)ftpc->count1;
  CURLcode result = CURLE_OK;

  /* The FTP spec tells a positive response should have code 200.
     Be more permissive here to tolerate deviant servers. */
  if(ftpcode / 100 != 2) {
    /* the command failed */

    if(EPRT == fcmd) {
      infof(data, "disabling EPRT usage\n");
      conn->bits.ftp_use_eprt = FALSE;
    }
    fcmd++;

    if(fcmd == DONE) {
      failf(data, "Failed to do PORT");
      result = CURLE_FTP_PORT_FAILED;
    }
    else
      /* try next */
      result = ftp_state_use_port(conn, fcmd);
  }
  else {
    infof(data, "Connect data stream actively\n");
    state(conn, FTP_STOP); /* end of DO phase */
    result = ftp_dophase_done(conn, FALSE);
  }

  return result;
}